

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::Btree_map_int64_Test::TestBody(Btree_map_int64_Test *this)

{
  undefined8 uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [8];
  _Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  _Var7;
  size_type sVar8;
  ulong uVar9;
  Generator<std::pair<const_long,_long>_> GVar10;
  mapped_type *pmVar11;
  pointer ppVar12;
  Generator<std::pair<const_long,_long>_> GVar13;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *extraout_RDX;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *pvVar14;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *values;
  const_pointer extraout_RDX_02;
  const_pointer extraout_RDX_03;
  const_pointer hint;
  const_pointer hint_00;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  n;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_05;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_07;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_08;
  size_type n_00;
  mapped_type mVar15;
  int i;
  int iVar16;
  unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  *b;
  int in_R8D;
  char *pcVar17;
  btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
  *__tmp;
  AssertionResult AVar18;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> sorted_values;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> random_values;
  int64_t bytes1;
  int64_t original_bytes1;
  unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  container;
  Generator<std::pair<const_long,_long>_> generator;
  PropagatingCountingAlloc<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  allocator1;
  int64_t bytes2;
  AssertHelper local_110;
  pair<const_long,_long> local_108;
  undefined1 local_f8 [8];
  Generator<std::pair<const_long,_long>_> local_f0;
  pointer local_e8;
  undefined1 local_e0 [8];
  _Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  _Stack_d8;
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  Generator<std::pair<const_long,_long>_> local_c0;
  Generator<std::pair<const_long,_long>_> local_b8;
  btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
  local_b0;
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  local_90;
  Generator<std::pair<const_long,_long>_> local_60;
  _Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  local_58;
  CountingAllocator<std::pair<const_long,_long>_> local_50;
  long local_48;
  pointer local_40;
  pointer local_38;
  
  (anonymous_namespace)::
  ConstTest<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>>
            ();
  GenerateValuesWithSeed<std::pair<long,long>>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_e0,
             (priv *)0x2710,40000,testing::FLAGS_gtest_random_seed,in_R8D);
  local_b0.size_ = (size_type)&local_b0;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )&btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
          ::EmptyNode()::empty_node;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       &btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
        ::EmptyNode()::empty_node;
  local_b0.rightmost_ = (node_type *)0x0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_f8,
             (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_e0);
  auVar6 = local_f8;
  GVar10 = local_f0;
  pvVar14 = extraout_RDX;
  if ((Generator<std::pair<const_long,_long>_>)local_f8 != local_f0) {
    uVar9 = (long)local_f0 - (long)local_f8 >> 4;
    lVar2 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_f8,local_f0,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar6,GVar10);
    pvVar14 = extraout_RDX_00;
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>,std::pair<long,long>>
            ((char *)&local_b0,
             (unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)local_f8,pvVar14);
  pvVar14 = (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
            CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),
                     (Generator<std::pair<const_long,_long>_>)local_f8 != local_f0);
  GVar13 = (Generator<std::pair<const_long,_long>_>)((long)local_f0 + -0x10);
  GVar10 = (Generator<std::pair<const_long,_long>_>)local_f8;
  if ((ulong)local_f8 < (ulong)GVar13 &&
      (Generator<std::pair<const_long,_long>_>)local_f8 != local_f0) {
    do {
      uVar1 = *(undefined8 *)GVar10;
      *(undefined8 *)GVar10 = *(undefined8 *)GVar13;
      *(undefined8 *)GVar13 = uVar1;
      pvVar14 = *(vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> **)
                 ((long)GVar10 + 8);
      *(long *)((long)GVar10 + 8) = *(long *)((long)GVar13 + 8);
      *(vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> **)((long)GVar13 + 8)
           = pvVar14;
      GVar10 = (Generator<std::pair<const_long,_long>_>)((long)GVar10 + 0x10);
      GVar13 = (Generator<std::pair<const_long,_long>_>)((long)GVar13 + -0x10);
    } while ((ulong)GVar10 < (ulong)GVar13);
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>,std::pair<long,long>>
            ((char *)&local_b0,
             (unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)local_f8,pvVar14);
  b = (unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
       *)local_e0;
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>,std::pair<long,long>>
            ((char *)&local_b0,b,values);
  if ((Generator<std::pair<const_long,_long>_>)local_f8 !=
      (Generator<std::pair<const_long,_long>_>)0x0) {
    b = (unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         *)((long)local_e8 - (long)local_f8);
    operator_delete((void *)local_f8,(ulong)b);
  }
  std::
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  ::~_Rb_tree(&local_90);
  btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
  ::~btree((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
            *)&local_b0);
  hint = extraout_RDX_02;
  if ((_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
       )local_e0 !=
      (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
       *)0x0) {
    b = (unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         *)((long)local_d0 - (long)local_e0);
    operator_delete((void *)local_e0,(ulong)b);
    hint = extraout_RDX_03;
  }
  local_c0.tgen.maxval = 0;
  local_c0.ugen.maxval = 0;
  local_48 = 0;
  local_60.tgen.maxval = 1000;
  local_60.ugen.maxval = 1000;
  local_58._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)&local_48;
  local_50.bytes_used_ = (int64_t *)&local_c0;
  local_40 = CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
             ::allocate((CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                         *)&local_50,(size_type)b,hint);
  local_38 = CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
             ::allocate((CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                         *)&local_58,(size_type)b,hint_00);
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  local_b0.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b0.size_ = 0;
  _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)&local_48;
  local_e0 = (undefined1  [8])
             btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
             ::EmptyNode()::empty_node;
  local_d0 = (_Base_ptr)
             btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
             ::EmptyNode()::empty_node;
  local_c8 = (_Base_ptr)0x0;
  local_b8 = local_c0;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)&local_c0;
  local_108 = Generator<std::pair<const_long,_long>_>::operator()(&local_60,0);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
            *)local_f8,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
            *)&local_b0,&local_108);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_b8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  }
  if (local_b0.size_ != 0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear(&local_b0,
                     (node_type *)
                     local_b0.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                     ._M_head_impl);
  }
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  local_b0.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b0.size_ = 0;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_108.second;
  local_108 = (pair<const_long,_long>)(auVar3 << 0x40);
  local_110.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_f8,"b1.size()","0",(unsigned_long *)&local_108,(int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c2,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  }
  local_108.first = (long)local_c8;
  local_110.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_f8,"b2.size()","0",(unsigned_long *)&local_108,(int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c3,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_b8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c4,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  }
  iVar16 = 1;
  do {
    local_108 = Generator<std::pair<const_long,_long>_>::operator()(&local_60,iVar16);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
              *)local_f8,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
              *)&local_b0,&local_108);
    iVar16 = iVar16 + 1;
  } while (iVar16 != 1000);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes2","bytes1",&local_48,(long *)&local_c0);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2cb,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  }
  if (local_c8 != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                      *)local_e0,(node_type *)local_e0);
  }
  if (local_b0.size_ != 0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear(&local_b0,
                     (node_type *)
                     local_b0.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                     ._M_head_impl);
  }
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)local_50.bytes_used_;
  local_b0.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b0.size_ = 0;
  _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       local_58._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
  local_e0 = (undefined1  [8])
             btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
             ::EmptyNode()::empty_node;
  local_d0 = (_Base_ptr)
             btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
             ::EmptyNode()::empty_node;
  local_c8 = (_Base_ptr)0x0;
  local_b8 = local_c0;
  local_108 = Generator<std::pair<const_long,_long>_>::operator()(&local_60,0);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
            *)local_f8,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
            *)&local_b0,&local_108);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_b8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d5,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  }
  if (local_b0.size_ != 0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear(&local_b0,
                     (node_type *)
                     local_b0.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                     ._M_head_impl);
  }
  _Var7._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       local_b0.root_.
       super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
       .
       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
       .
       super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
       ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  local_b0.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b0.size_ = 0;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
  _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       _Var7._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
  local_e0 = (undefined1  [8])
             btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
             ::EmptyNode()::empty_node;
  local_d0 = (_Base_ptr)
             btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
             ::EmptyNode()::empty_node;
  local_c8 = (_Base_ptr)0x0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_108.second;
  local_108 = (pair<const_long,_long>)(auVar4 << 0x40);
  local_110.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_f8,"b1.size()","0",(unsigned_long *)&local_108,(int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d9,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_b8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2da,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  }
  iVar16 = 1;
  do {
    local_108 = Generator<std::pair<const_long,_long>_>::operator()(&local_60,iVar16);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
              *)local_f8,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
              *)&local_b0,&local_108);
    iVar16 = iVar16 + 1;
  } while (iVar16 != 1000);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes2","bytes1",&local_48,(long *)&local_c0);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2e1,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  }
  if (local_c8 != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                      *)local_e0,(node_type *)local_e0);
  }
  if (local_b0.size_ != 0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear(&local_b0,
                     (node_type *)
                     local_b0.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                     ._M_head_impl);
  }
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)local_50.bytes_used_;
  local_b0.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b0.size_ = 0;
  _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       local_58._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
  local_e0 = (undefined1  [8])
             btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
             ::EmptyNode()::empty_node;
  local_d0 = (_Base_ptr)
             btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
             ::EmptyNode()::empty_node;
  local_c8 = (_Base_ptr)0x0;
  local_b8 = local_c0;
  local_108 = Generator<std::pair<const_long,_long>_>::operator()(&local_60,0);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
            *)local_f8,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
            *)&local_b0,&local_108);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_b8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2eb,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  }
  sVar8 = local_b0.size_;
  local_d0 = (_Base_ptr)local_b0.rightmost_;
  _Var7._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       local_b0.root_.
       super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
       .
       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
       .
       super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
       ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
  local_e0 = (undefined1  [8])
             local_b0.root_.
             super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
             .
             super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  ;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       _Var7._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
  local_b0.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b0.size_ = 0;
  local_c8 = (_Base_ptr)sVar8;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_108.second;
  local_108 = (pair<const_long,_long>)(auVar5 << 0x40);
  local_110.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_f8,"b1.size()","0",(unsigned_long *)&local_108,(int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2ef,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  }
  local_108.first = sVar8;
  local_110.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_f8,"b2.size()","1",(unsigned_long *)&local_108,(int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f0,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_b8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f1,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  }
  iVar16 = 1;
  do {
    local_108 = Generator<std::pair<const_long,_long>_>::operator()(&local_60,iVar16);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
              *)local_f8,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
              *)&local_b0,&local_108);
    iVar16 = iVar16 + 1;
  } while (iVar16 != 1000);
  AVar18 = testing::internal::CmpHelperGT<long,long>
                     ((internal *)local_f8,"bytes2","bytes1",&local_48,(long *)&local_c0);
  n._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar18.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (char *)*(long *)local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f8,pcVar17);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    n = extraout_RDX_04.
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl;
    if ((long *)local_108.first != (long *)0x0) {
      (**(code **)(*(long *)local_108.first + 8))();
      n._M_head_impl = extraout_RDX_05;
    }
  }
  if (local_f0 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
    n._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_06.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  if (local_c8 != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                      *)local_e0,(node_type *)local_e0);
    n._M_head_impl = extraout_RDX_07;
  }
  if (local_b0.size_ != 0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear(&local_b0,
                     (node_type *)
                     local_b0.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                     ._M_head_impl);
    n._M_head_impl = extraout_RDX_08._M_head_impl;
  }
  CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  ::deallocate((CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                *)&local_50,local_40,(size_type)n._M_head_impl);
  CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  ::deallocate((CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                *)&local_58,local_38,n_00);
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )&btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
          ::EmptyNode()::empty_node;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       &btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
        ::EmptyNode()::empty_node;
  local_b0.rightmost_ = (node_type *)0x0;
  iVar16 = 0;
  do {
    local_f8 = (undefined1  [8])0x3e8000003e8;
    _local_e0 = Generator<std::pair<const_long,_long>_>::operator()
                          ((Generator<std::pair<const_long,_long>_> *)local_f8,iVar16);
    mVar15 = local_e0._8_8_;
    pmVar11 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
              ::operator[]((btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                            *)&local_b0,(key_type *)local_e0);
    *pmVar11 = mVar15;
    iVar16 = iVar16 + 1;
  } while (iVar16 != 1000);
  local_f8 = (undefined1  [8])local_b0.rightmost_;
  local_108.first._0_4_ = 1000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e0,"b.size()","1000",(unsigned_long *)local_f8,(int *)&local_108);
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f8);
    if ((CountingAllocator<std::pair<const_long,_long>_>)
        _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = *(char **)_Stack_d8._M_head_impl.
                          super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x30e,pcVar17);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((Generator<std::pair<const_long,_long>_>)local_f8 !=
        (Generator<std::pair<const_long,_long>_>)0x0) {
      (**(code **)(*(long *)local_f8 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_long,_long>_>)
      _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_e0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                 bytes_used_);
  }
  if (((ulong)local_b0.root_.
              super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
              ._M_head_impl & 7) == 0) {
    uVar9 = *(ulong *)local_b0.root_.
                      super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                      .
                      super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                      .
                      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                      .
                      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                      ._M_head_impl;
    if ((uVar9 & 7) == 0) {
      local_108.first = 0x3e8000003e8;
      _local_f8 = Generator<std::pair<const_long,_long>_>::operator()
                            ((Generator<std::pair<const_long,_long>_> *)&local_108,0);
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)local_e0,"b.begin()->first","Generator<value_type>(1000)(0).first",
                 (long *)(uVar9 + 0x10),(long *)local_f8);
      if (local_e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_f8);
        if ((CountingAllocator<std::pair<const_long,_long>_>)
            _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_
            == (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
          pcVar17 = "";
        }
        else {
          pcVar17 = *(char **)_Stack_d8._M_head_impl.
                              super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_108,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x313,pcVar17);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
        if ((Generator<std::pair<const_long,_long>_>)local_f8 !=
            (Generator<std::pair<const_long,_long>_>)0x0) {
          (**(code **)(*(long *)local_f8 + 8))();
        }
      }
      if ((CountingAllocator<std::pair<const_long,_long>_>)
          _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_
          != (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_e0 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                     bytes_used_);
      }
      if (((ulong)local_b0.root_.
                  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                  .
                  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                  .
                  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                  .
                  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                  ._M_head_impl & 7) != 0) goto LAB_0013a56c;
      uVar9 = *(ulong *)local_b0.root_.
                        super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                        .
                        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                        ._M_head_impl;
      if ((uVar9 & 7) == 0) {
        local_108.first = 0x3e8000003e8;
        _local_f8 = Generator<std::pair<const_long,_long>_>::operator()
                              ((Generator<std::pair<const_long,_long>_> *)&local_108,0);
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)local_e0,"b.begin()->second","Generator<value_type>(1000)(0).second",
                   (long *)(uVar9 + 0x18),(long *)(local_f8 + 8));
        if (local_e0[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_f8);
          if ((CountingAllocator<std::pair<const_long,_long>_>)
              _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
              bytes_used_ == (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
            pcVar17 = "";
          }
          else {
            pcVar17 = *(char **)_Stack_d8._M_head_impl.
                                super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_108,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x314,pcVar17);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
          if ((Generator<std::pair<const_long,_long>_>)local_f8 !=
              (Generator<std::pair<const_long,_long>_>)0x0) {
            (**(code **)(*(long *)local_f8 + 8))();
          }
        }
        if ((CountingAllocator<std::pair<const_long,_long>_>)
            _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_
            != (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_e0 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                       bytes_used_);
        }
        if (((ulong)local_b0.root_.
                    super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                    .
                    super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                    .
                    super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                    ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_
            & 7) == 0) {
          local_f0.tgen.maxval._0_1_ =
               *(undefined1 *)
                ((long)local_b0.root_.
                       super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                       .
                       super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                       ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                       bytes_used_ + 10);
          local_f8 = (undefined1  [8])
                     local_b0.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                     ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_
          ;
          local_f0.tgen.maxval._1_3_ = 0;
          ppVar12 = std::
                    reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>_>
                    ::operator->((reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>_>
                                  *)local_f8);
          local_c0.tgen.maxval = 1000;
          local_c0.ugen.maxval = 1000;
          local_108 = Generator<std::pair<const_long,_long>_>::operator()(&local_c0,999);
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_e0,"b.rbegin()->first",
                     "Generator<value_type>(1000)(999).first",&ppVar12->first,&local_108.first);
          if (local_e0[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_f8);
            if ((CountingAllocator<std::pair<const_long,_long>_>)
                _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                bytes_used_ == (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
              pcVar17 = "";
            }
            else {
              pcVar17 = *(char **)_Stack_d8._M_head_impl.
                                  super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_108,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                       ,0x315,pcVar17);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_108,(Message *)local_f8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
            if ((Generator<std::pair<const_long,_long>_>)local_f8 !=
                (Generator<std::pair<const_long,_long>_>)0x0) {
              (**(code **)(*(long *)local_f8 + 8))();
            }
          }
          if ((CountingAllocator<std::pair<const_long,_long>_>)
              _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
              bytes_used_ != (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_e0 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Stack_d8._M_head_impl.
                         super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_);
          }
          if (((ulong)local_b0.root_.
                      super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                      .
                      super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                      .
                      super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                      ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                      bytes_used_ & 7) == 0) {
            local_f0.tgen.maxval._0_1_ =
                 *(undefined1 *)
                  ((long)local_b0.root_.
                         super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                         .
                         super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                         .
                         super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                         ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                         bytes_used_ + 10);
            local_f8 = (undefined1  [8])
                       local_b0.root_.
                       super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                       .
                       super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                       ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                       bytes_used_;
            local_f0.tgen.maxval._1_3_ = 0;
            ppVar12 = std::
                      reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>_>
                      ::operator->((reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>_>
                                    *)local_f8);
            local_c0.tgen.maxval = 1000;
            local_c0.ugen.maxval = 1000;
            local_108 = Generator<std::pair<const_long,_long>_>::operator()(&local_c0,999);
            testing::internal::CmpHelperEQ<long,long>
                      ((internal *)local_e0,"b.rbegin()->second",
                       "Generator<value_type>(1000)(999).second",&ppVar12->second,&local_108.second)
            ;
            if (local_e0[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_f8);
              if ((CountingAllocator<std::pair<const_long,_long>_>)
                  _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                  bytes_used_ == (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
                pcVar17 = "";
              }
              else {
                pcVar17 = *(char **)_Stack_d8._M_head_impl.
                                    super_CountingAllocator<std::pair<const_long,_long>_>.
                                    bytes_used_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_108,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                         ,0x316,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_108,(Message *)local_f8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
              if ((Generator<std::pair<const_long,_long>_>)local_f8 !=
                  (Generator<std::pair<const_long,_long>_>)0x0) {
                (**(code **)(*(long *)local_f8 + 8))();
              }
            }
            if ((CountingAllocator<std::pair<const_long,_long>_>)
                _Stack_d8._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                bytes_used_ != (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_e0 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           _Stack_d8._M_head_impl.
                           super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_);
            }
            btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
            ::~btree((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                      *)&local_b0);
            return;
          }
        }
        pcVar17 = 
        "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
        ;
        goto LAB_0013a5af;
      }
    }
    pcVar17 = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
    ;
  }
  else {
LAB_0013a56c:
    pcVar17 = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
LAB_0013a5af:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,pcVar17);
}

Assistant:

void BtreeTest() {
        ConstTest<T>();

        using V = typename remove_pair_const<typename T::value_type>::type;
        const std::vector<V> random_values = GenerateValuesWithSeed<V>(
            test_values, 4 * test_values,
            GTEST_FLAG_GET(random_seed));

        unique_checker<T, C> container;

        // Test key insertion/deletion in sorted order.
        std::vector<V> sorted_values(random_values);
        std::sort(sorted_values.begin(), sorted_values.end());
        DoTest("sorted:    ", &container, sorted_values);

        // Test key insertion/deletion in reverse sorted order.
        std::reverse(sorted_values.begin(), sorted_values.end());
        DoTest("rsorted:   ", &container, sorted_values);

        // Test key insertion/deletion in random order.
        DoTest("random:    ", &container, random_values);
    }